

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O2

PromiseFromSignal<void_(Object::*)(int,_const_QString_&)>
QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
          (Object *sender,offset_in_Object_to_subr signal)

{
  QSharedData *pQVar1;
  PromiseData<int> *this;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> extraout_RDX;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> PVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_70;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_60;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_58;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_50;
  QPromiseBase<int> local_48;
  QPromiseConnections local_38;
  
  *(undefined ***)sender = &PTR__QPromiseBase_00127740;
  this = (PromiseData<int> *)operator_new(0x68);
  (this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this);
  *(PromiseData<int> **)&sender->field_0x8 = this;
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_48.m_d.d = *(PromiseData<int> **)&sender->field_0x8;
  if (local_48.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_48.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127a58;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_48);
  QPromiseBase<int>::~QPromiseBase(&local_48);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_58.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_50.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_50 = resolver.m_d.d;
  }
  local_60.d = (Data *)0x0;
  local_70 = resolver.m_d.d;
  std::make_shared<QtPromise::QPromiseConnections::Data>();
  QtPromisePrivate::connectSignalToResolver<int,Object,void(Object::*)(int,QString_const&)>
            (&local_38,(QPromiseResolve<int> *)&local_70,(Object *)signal,0x117246);
  QtPromisePrivate::connectDestroyedToReject<int,Object>
            (&local_38,(QPromiseReject<void> *)&local_50,(Object *)signal);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m_d.
              super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_50);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_70);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_58);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  *(undefined ***)sender = &PTR__QPromiseBase_00127a58;
  PVar2.super_QPromiseBase<int>.m_d.d = extraout_RDX.d;
  PVar2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)sender;
  return (PromiseFromSignal<void_(Object::*)(int,_const_QString_&)>)PVar2.super_QPromiseBase<int>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFromSignal<Signal>
connect(const Sender* sender, Signal signal)
{
    using namespace QtPromisePrivate;
    using T = typename PromiseFromSignal<Signal>::Type;

    return QPromise<T>{[&](const QPromiseResolve<T>& resolve, const QPromiseReject<T>& reject) {
        QPromiseConnections connections;
        connectSignalToResolver(connections, resolve, sender, signal);
        connectDestroyedToReject(connections, reject, sender);
    }};
}